

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_7.cpp
# Opt level: O0

Token * __thiscall Token_stream::get(Token *__return_storage_ptr__,Token_stream *this)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  uint32_t uVar5;
  long *plVar6;
  allocator<char> local_c1;
  string local_c0;
  string local_a0;
  undefined4 local_7c;
  undefined1 local_78 [8];
  string s;
  Roman_int local_48;
  double local_28;
  double val;
  Token_stream *pTStack_18;
  char ch;
  Token_stream *this_local;
  
  pTStack_18 = this;
  this_local = (Token_stream *)__return_storage_ptr__;
  if ((this->full & 1U) == 0) {
    val._7_1_ = std::istream::get();
    iVar4 = (int)val._7_1_;
    if (((((iVar4 == 0x23) || (iVar4 == 0x25)) || (iVar4 - 0x28U < 6)) ||
        ((iVar4 == 0x2f || (iVar4 == 0x3b)))) || (iVar4 == 0x3d)) {
      Token::Token(__return_storage_ptr__,val._7_1_);
    }
    else if (((iVar4 - 0x43U < 2) || (iVar4 == 0x49)) ||
            ((iVar4 - 0x4cU < 2 || ((iVar4 == 0x56 || (iVar4 == 0x58)))))) {
      std::istream::unget();
      get_numeral(&local_48,(istream *)&std::cin);
      uVar5 = Roman_int::as_int(&local_48);
      Roman_int::~Roman_int(&local_48);
      local_28 = (double)uVar5;
      Token::Token(__return_storage_ptr__,'8',(double)uVar5);
    }
    else {
      iVar4 = isalpha((int)val._7_1_);
      if (iVar4 == 0) {
        iVar4 = isspace((int)val._7_1_);
        if (iVar4 == 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_c0,"Bad token",&local_c1);
          error(&local_c0);
          std::__cxx11::string::~string((string *)&local_c0);
          std::allocator<char>::~allocator(&local_c1);
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        if (val._7_1_ == '\n') {
          Token::Token(__return_storage_ptr__,';');
        }
        else {
          get(__return_storage_ptr__,this);
        }
      }
      else {
        std::__cxx11::string::string((string *)local_78);
        std::__cxx11::string::operator+=((string *)local_78,val._7_1_);
        while( true ) {
          plVar6 = (long *)std::istream::get((char *)this->is);
          bVar2 = std::ios::operator_cast_to_bool
                            ((ios *)((long)plVar6 + *(long *)(*plVar6 + -0x18)));
          bVar3 = false;
          if (bVar2) {
            iVar4 = isalpha((int)val._7_1_);
            bVar3 = true;
            if (iVar4 == 0) {
              iVar4 = isdigit((int)val._7_1_);
              bVar3 = true;
              if (iVar4 == 0) {
                bVar3 = val._7_1_ == '_';
              }
            }
          }
          if (!bVar3) break;
          std::__cxx11::string::operator+=((string *)local_78,val._7_1_);
        }
        std::istream::unget();
        bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_78,"exit");
        if (bVar3) {
          Token::Token(__return_storage_ptr__,'Q');
        }
        else {
          bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_78,"sqrt");
          if (bVar3) {
            Token::Token(__return_storage_ptr__,'R');
          }
          else {
            bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_78,"pow");
            if (bVar3) {
              Token::Token(__return_storage_ptr__,'P');
            }
            else {
              bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_78,"const");
              if (bVar3) {
                Token::Token(__return_storage_ptr__,'C');
              }
              else {
                bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_78,"help");
                if (bVar3) {
                  Token::Token(__return_storage_ptr__,'H');
                }
                else {
                  bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_78,"ln");
                  if (bVar3) {
                    Token::Token(__return_storage_ptr__,'N');
                  }
                  else {
                    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_78,"from");
                    if (bVar3) {
                      Token::Token(__return_storage_ptr__,'F');
                    }
                    else {
                      bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)local_78,"to");
                      if (bVar3) {
                        Token::Token(__return_storage_ptr__,'T');
                      }
                      else {
                        std::__cxx11::string::string((string *)&local_a0,(string *)local_78);
                        Token::Token(__return_storage_ptr__,'a',&local_a0);
                        std::__cxx11::string::~string((string *)&local_a0);
                      }
                    }
                  }
                }
              }
            }
          }
        }
        local_7c = 1;
        std::__cxx11::string::~string((string *)local_78);
      }
    }
  }
  else {
    this->full = false;
    Token::Token(__return_storage_ptr__,&this->buffer);
  }
  return __return_storage_ptr__;
}

Assistant:

Token Token_stream::get()
{
	if (full) { full = false; return buffer; }
	char ch;
	ch = is.get();
	switch (ch)
	{
	case '(':
	case ')':
	case '+':
	case '-':
	case '*':
	case '/':
	case '%':
	case ';':
	case ',':
	case '=':
	case '#':
		return Token(ch);
	case 'I':
	case 'V':
	case 'X':
	case 'L':
	case 'C':
	case 'D':
	case 'M':
	{
		cin.unget(); // put back character to read full double later
		double val = get_numeral(cin).as_int();
		return Token(number, val);
	}
	default:
		if (isalpha(ch))
		{
			string s;
			s += ch;
			while (is.get(ch) && (isalpha(ch) || isdigit(ch) || ch == '_'))
				s += ch;
			cin.unget();
			if (s == "exit")
				return Token(quit);
			if (s == "sqrt")
				return Token(square_root);
			if (s == "pow")
				return Token(power);
			if (s == "const")
				return Token(constant);
			if (s == "help")
				return Token(help);
			if (s == "ln")
				return Token(natural_log);
			if (s == "from")
				return Token(from);
			if (s == "to")
				return Token(to);
			return Token(name, s);
		}
		else if (isspace(ch))
		{
			if (ch == '\n')
				return Token(print);
			return get();
		}
		error("Bad token");
	}
}